

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gesture_acts.cpp
# Opt level: O3

ostream * operator<<(ostream *os,datarow *dr)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"datarow<ACC(",0xc);
  poVar1 = std::ostream::_M_insert<double>(dr->acc_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(dr->acc_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(dr->acc_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), GYR(",7);
  poVar1 = std::ostream::_M_insert<double>(dr->gyr_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(dr->gyr_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(dr->gyr_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), t(",5);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")>",2);
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const datarow &dr){
    os << "datarow<ACC(" << dr.acc_x << ", " << dr.acc_y << ", " << dr.acc_z << "), GYR("
       << dr.gyr_x << ", " << dr.gyr_y << ", " << dr.gyr_z << "), t(" << dr.timestamp << ")>";
    return os;
}